

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy_dedicatedDictSearch
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *piVar1;
  BYTE *iLimit;
  BYTE *iStart;
  BYTE *pBVar2;
  int *piVar3;
  BYTE *pBVar4;
  uint uVar5;
  BYTE *pBVar6;
  ZSTD_matchState_t *pZVar7;
  BYTE *pBVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  int iVar13;
  U32 UVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  size_t sVar17;
  ulong uVar18;
  int *piVar19;
  BYTE *litEnd;
  int *piVar20;
  BYTE *pBVar21;
  long lVar22;
  U32 UVar23;
  int *piVar24;
  seqDef *psVar25;
  U32 UVar26;
  U32 UVar27;
  BYTE *litLimit_w;
  size_t offsetFound;
  size_t local_58;
  U32 *local_50;
  BYTE *local_48;
  ZSTD_matchState_t *local_40;
  BYTE *local_38;
  
  iLimit = (BYTE *)((long)src + srcSize);
  piVar3 = (int *)((long)src + (srcSize - 8));
  pBVar6 = (ms->window).base;
  uVar5 = (ms->window).dictLimit;
  iStart = pBVar6 + uVar5;
  UVar27 = *rep;
  pZVar7 = ms->dictMatchState;
  pBVar8 = (pZVar7->window).nextSrc;
  local_38 = (pZVar7->window).base;
  local_48 = local_38 + (pZVar7->window).dictLimit;
  UVar23 = rep[1];
  piVar24 = (int *)((ulong)(((int)src - ((int)local_48 + (int)iStart)) + (int)pBVar8 == 0) +
                   (long)src);
  if (piVar24 < piVar3) {
    uVar10 = ((int)local_38 - (int)pBVar8) + uVar5;
    pBVar15 = local_38 + -(ulong)uVar10;
    piVar1 = (int *)(iLimit + -0x20);
    local_50 = rep;
    local_40 = ms;
    do {
      piVar19 = (int *)((long)piVar24 + 1);
      uVar11 = (((int)piVar24 - (int)pBVar6) - UVar27) + 1;
      piVar20 = (int *)(pBVar6 + uVar11);
      if (uVar11 < uVar5) {
        piVar20 = (int *)(local_38 + (uVar11 - uVar10));
      }
      if ((uVar11 - uVar5 < 0xfffffffd) && (*piVar20 == *piVar19)) {
        pBVar16 = iLimit;
        if (uVar11 < uVar5) {
          pBVar16 = pBVar8;
        }
        sVar12 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar24 + 5),(BYTE *)(piVar20 + 1),iLimit,pBVar16,iStart)
        ;
        sVar17 = sVar12 + 4;
LAB_005e41e5:
        UVar14 = 1;
        UVar26 = UVar27;
        UVar27 = UVar23;
LAB_005e4218:
        uVar18 = (long)piVar19 - (long)src;
        pBVar16 = seqStore->lit;
        if (piVar1 < piVar19) {
          piVar24 = (int *)src;
          pBVar21 = pBVar16;
          if (src <= piVar1) {
            pBVar21 = pBVar16 + ((long)piVar1 - (long)src);
            uVar9 = *(undefined8 *)((long)src + 8);
            *(undefined8 *)pBVar16 = *src;
            *(undefined8 *)(pBVar16 + 8) = uVar9;
            piVar24 = piVar1;
            if (0x10 < (long)piVar1 - (long)src) {
              lVar22 = 0x10;
              do {
                uVar9 = *(undefined8 *)((BYTE *)((long)src + lVar22) + 8);
                pBVar2 = pBVar16 + lVar22;
                *(undefined8 *)pBVar2 = *(undefined8 *)((long)src + lVar22);
                *(undefined8 *)(pBVar2 + 8) = uVar9;
                pBVar4 = (BYTE *)((long)src + lVar22 + 0x10);
                uVar9 = *(undefined8 *)(pBVar4 + 8);
                *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar4;
                *(undefined8 *)(pBVar2 + 0x18) = uVar9;
                lVar22 = lVar22 + 0x20;
              } while (pBVar2 + 0x20 < pBVar21);
            }
          }
          if (piVar24 < piVar19) {
            lVar22 = 0;
            do {
              pBVar21[lVar22] = *(BYTE *)((long)piVar24 + lVar22);
              lVar22 = lVar22 + 1;
            } while ((long)piVar19 - (long)piVar24 != lVar22);
          }
LAB_005e42f0:
          seqStore->lit = seqStore->lit + uVar18;
          psVar25 = seqStore->sequences;
          if (0xffff < uVar18) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar9 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar16 = *src;
          *(undefined8 *)(pBVar16 + 8) = uVar9;
          pBVar16 = seqStore->lit;
          if (0x10 < uVar18) {
            uVar9 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar16 + 0x18) = uVar9;
            if (0x20 < (long)uVar18) {
              lVar22 = 0;
              do {
                pBVar2 = (BYTE *)((long)src + lVar22 + 0x20);
                uVar9 = *(undefined8 *)(pBVar2 + 8);
                pBVar21 = pBVar16 + lVar22 + 0x20;
                *(undefined8 *)pBVar21 = *(undefined8 *)pBVar2;
                *(undefined8 *)(pBVar21 + 8) = uVar9;
                pBVar2 = (BYTE *)((long)src + lVar22 + 0x30);
                uVar9 = *(undefined8 *)(pBVar2 + 8);
                *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)pBVar2;
                *(undefined8 *)(pBVar21 + 0x18) = uVar9;
                lVar22 = lVar22 + 0x20;
              } while (pBVar21 + 0x20 < pBVar16 + uVar18);
            }
            goto LAB_005e42f0;
          }
          seqStore->lit = pBVar16 + uVar18;
          psVar25 = seqStore->sequences;
        }
        psVar25->litLength = (U16)uVar18;
        psVar25->offset = UVar14;
        if (0xffff < sVar17 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar25->matchLength = (U16)(sVar17 - 3);
        psVar25 = psVar25 + 1;
        seqStore->sequences = psVar25;
        UVar23 = UVar27;
        for (piVar24 = (int *)((long)piVar19 + sVar17); UVar27 = UVar26, src = piVar24,
            piVar24 <= piVar3; piVar24 = (int *)((long)piVar24 + sVar12 + 4)) {
          uVar11 = ((int)piVar24 - (int)pBVar6) - UVar23;
          pBVar16 = pBVar6;
          if (uVar11 < uVar5) {
            pBVar16 = pBVar15;
          }
          if ((0xfffffffc < uVar11 - uVar5) || (*(int *)(pBVar16 + uVar11) != *piVar24)) break;
          pBVar21 = iLimit;
          if (uVar11 < uVar5) {
            pBVar21 = pBVar8;
          }
          sVar12 = ZSTD_count_2segments
                             ((BYTE *)(piVar24 + 1),(BYTE *)((long)(pBVar16 + uVar11) + 4),iLimit,
                              pBVar21,iStart);
          if (piVar24 <= piVar1) {
            pBVar16 = seqStore->lit;
            uVar9 = *(undefined8 *)(piVar24 + 2);
            *(undefined8 *)pBVar16 = *(undefined8 *)piVar24;
            *(undefined8 *)(pBVar16 + 8) = uVar9;
            psVar25 = seqStore->sequences;
          }
          psVar25->litLength = 0;
          psVar25->offset = 1;
          if (0xffff < sVar12 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar25->matchLength = (U16)(sVar12 + 1);
          psVar25 = psVar25 + 1;
          seqStore->sequences = psVar25;
          UVar26 = UVar23;
          UVar23 = UVar27;
        }
      }
      else {
        local_58 = 999999999;
        sVar12 = ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS
                           (local_40,(BYTE *)piVar24,iLimit,&local_58);
        if (sVar12 != 0) {
          piVar19 = piVar24;
        }
        if (3 < sVar12) {
          sVar17 = sVar12;
          if (local_58 == 0) goto LAB_005e41e5;
          uVar18 = (long)piVar24 + (-(long)pBVar6 - local_58) + -0xfffffffe;
          pBVar21 = pBVar6;
          pBVar16 = iStart;
          if ((uint)uVar18 < uVar5) {
            pBVar21 = pBVar15;
            pBVar16 = local_48;
          }
          if ((src < piVar24) && (uVar18 = uVar18 & 0xffffffff, pBVar16 < pBVar21 + uVar18)) {
            pBVar21 = pBVar21 + uVar18;
            do {
              piVar24 = (int *)((long)piVar19 + -1);
              pBVar21 = pBVar21 + -1;
              if ((*(BYTE *)piVar24 != *pBVar21) ||
                 (sVar17 = sVar17 + 1, piVar19 = piVar24, piVar24 <= src)) break;
            } while (pBVar16 < pBVar21);
          }
          iVar13 = (int)local_58;
          if (sVar12 == 0) {
            iVar13 = 0;
          }
          UVar26 = iVar13 - 2;
          UVar14 = iVar13 + 1;
          goto LAB_005e4218;
        }
        piVar24 = (int *)((long)piVar24 + ((long)piVar24 - (long)src >> 8) + 1);
      }
      rep = local_50;
    } while (piVar24 < piVar3);
  }
  *rep = UVar27;
  rep[1] = UVar23;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dedicatedDictSearch(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_dedicatedDictSearch);
}